

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::ShaderAtomicOpTests::init(ShaderAtomicOpTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  ShaderAtomicOpTests *this_local;
  
  pTVar1 = &createAtomicOpGroup<deqp::gles31::Functional::ShaderAtomicAddCase>
                      ((this->super_TestCaseGroup).m_context,this->m_operandType,"add")->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = &createAtomicOpGroup<deqp::gles31::Functional::ShaderAtomicMinCase>
                      ((this->super_TestCaseGroup).m_context,this->m_operandType,"min")->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = &createAtomicOpGroup<deqp::gles31::Functional::ShaderAtomicMaxCase>
                      ((this->super_TestCaseGroup).m_context,this->m_operandType,"max")->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = &createAtomicOpGroup<deqp::gles31::Functional::ShaderAtomicAndCase>
                      ((this->super_TestCaseGroup).m_context,this->m_operandType,"and")->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = &createAtomicOpGroup<deqp::gles31::Functional::ShaderAtomicOrCase>
                      ((this->super_TestCaseGroup).m_context,this->m_operandType,"or")->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = &createAtomicOpGroup<deqp::gles31::Functional::ShaderAtomicXorCase>
                      ((this->super_TestCaseGroup).m_context,this->m_operandType,"xor")->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = &createAtomicOpGroup<deqp::gles31::Functional::ShaderAtomicExchangeCase>
                      ((this->super_TestCaseGroup).m_context,this->m_operandType,"exchange")->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = &createAtomicOpGroup<deqp::gles31::Functional::ShaderAtomicCompSwapCase>
                      ((this->super_TestCaseGroup).m_context,this->m_operandType,"compswap")->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void ShaderAtomicOpTests::init (void)
{
	addChild(createAtomicOpGroup<ShaderAtomicAddCase>		(m_context, m_operandType, "add"));
	addChild(createAtomicOpGroup<ShaderAtomicMinCase>		(m_context, m_operandType, "min"));
	addChild(createAtomicOpGroup<ShaderAtomicMaxCase>		(m_context, m_operandType, "max"));
	addChild(createAtomicOpGroup<ShaderAtomicAndCase>		(m_context, m_operandType, "and"));
	addChild(createAtomicOpGroup<ShaderAtomicOrCase>		(m_context, m_operandType, "or"));
	addChild(createAtomicOpGroup<ShaderAtomicXorCase>		(m_context, m_operandType, "xor"));
	addChild(createAtomicOpGroup<ShaderAtomicExchangeCase>	(m_context, m_operandType, "exchange"));
	addChild(createAtomicOpGroup<ShaderAtomicCompSwapCase>	(m_context, m_operandType, "compswap"));
}